

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageFuelReload.cpp
# Opt level: O1

bool __thiscall DIS::StorageFuelReload::operator==(StorageFuelReload *this,StorageFuelReload *rhs)

{
  return (this->_maximumQuantity == rhs->_maximumQuantity &&
         this->_standardQuantity == rhs->_standardQuantity) &&
         ((((this->_padding == rhs->_padding && rhs->_fuelLocation == this->_fuelLocation) &&
           (rhs->_fuelType == this->_fuelType &&
           rhs->_fuelMeasurementUnits == this->_fuelMeasurementUnits)) &&
          rhs->_maximumQuantityReloadTime == this->_maximumQuantityReloadTime) &&
         rhs->_standardQuantityReloadTime == this->_standardQuantityReloadTime);
}

Assistant:

bool StorageFuelReload::operator ==(const StorageFuelReload& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_standardQuantity == rhs._standardQuantity) ) ivarsEqual = false;
     if( ! (_maximumQuantity == rhs._maximumQuantity) ) ivarsEqual = false;
     if( ! (_standardQuantityReloadTime == rhs._standardQuantityReloadTime) ) ivarsEqual = false;
     if( ! (_maximumQuantityReloadTime == rhs._maximumQuantityReloadTime) ) ivarsEqual = false;
     if( ! (_fuelMeasurementUnits == rhs._fuelMeasurementUnits) ) ivarsEqual = false;
     if( ! (_fuelType == rhs._fuelType) ) ivarsEqual = false;
     if( ! (_fuelLocation == rhs._fuelLocation) ) ivarsEqual = false;
     if( ! (_padding == rhs._padding) ) ivarsEqual = false;

    return ivarsEqual;
 }